

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

uint32_t __thiscall booster::locale::gnu_gettext::mo_file::get(mo_file *this,uint offset)

{
  uint uVar1;
  uint uVar2;
  runtime_error *this_00;
  string local_40;
  
  if ((ulong)offset <= this->file_size_ - 4) {
    uVar1 = *(uint *)(this->data_ + offset);
    uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (this->native_byteorder_ != false) {
      uVar2 = uVar1;
    }
    return uVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Bad mo-file format","");
  runtime_error::runtime_error(this_00,&local_40);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

uint32_t get(unsigned offset) const
                {
                    uint32_t tmp;
                    if(offset > file_size_ - 4) {
                        throw booster::runtime_error("Bad mo-file format");
                    }
                    memcpy(&tmp,data_ + offset,4);
                    convert(tmp);
                    return tmp;
                }